

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_HealThing(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  int iVar2;
  
  if (it != (AActor *)0x0) {
    if ((arg1 == 0) || (it->player == (player_t *)0x0)) {
      P_GiveBody(it,arg0,0);
      return 1;
    }
    if (arg1 == 1) {
      arg1 = deh.MaxSoulsphere;
    }
    if (it->health < arg1) {
      iVar2 = it->health + arg0;
      iVar1 = arg1;
      if (iVar2 < arg1) {
        iVar1 = iVar2;
      }
      if (arg1 < 1) {
        iVar1 = iVar2;
      }
      it->health = iVar1;
      it->player->health = iVar1;
    }
  }
  return (int)(it != (AActor *)0x0);
}

Assistant:

FUNC(LS_HealThing)
// HealThing (amount, max)
{
	if (it)
	{
		int max = arg1;

		if (max == 0 || it->player == NULL)
		{
			P_GiveBody(it, arg0);
			return true;
		}
		else if (max == 1)
		{
			max = deh.MaxSoulsphere;
		}

		// If health is already above max, do nothing
		if (it->health < max)
		{
			it->health += arg0;
			if (it->health > max && max > 0)
			{
				it->health = max;
			}
			if (it->player)
			{
				it->player->health = it->health;
			}
		}
	}

	return it ? true : false;
}